

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeTransformMatrix
          (ChElementBeamTaperedTimoshenko *this)

{
  double *pdVar1;
  bool bVar2;
  undefined8 uVar3;
  element_type *peVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double *pdVar16;
  undefined8 *puVar17;
  char *__function;
  long lVar18;
  ulong uVar19;
  Index *src;
  SrcXprType *src_00;
  long lVar20;
  assign_op<double,_double> *func;
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 extraout_XMM0_Qb_05;
  undefined1 auVar31 [16];
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  ulong extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  ChMatrix33<double> rc;
  ChMatrix33<double> RotsectB;
  ChMatrix33<double> RotsectA;
  ChMatrixNM<double,_6,_6> Ts2;
  ChMatrixNM<double,_6,_6> Ts1;
  ChMatrixNM<double,_6,_6> Tc2;
  ChMatrixNM<double,_6,_6> Tc1;
  ChMatrixNM<double,_12,_12> Ts;
  ChMatrixNM<double,_12,_12> Rotsect;
  ChMatrixNM<double,_12,_12> Tc;
  Scalar local_1948;
  undefined1 local_1940 [8];
  undefined1 auStack_1938 [8];
  undefined1 local_1930 [8];
  ulong uStack_1928;
  double local_1918;
  double local_1910;
  double local_1908;
  double local_1900;
  ulong uStack_18f8;
  double local_18f0;
  ulong uStack_18e8;
  double local_18e0 [7];
  double local_18a8;
  double local_18a0;
  double dStack_1898;
  undefined8 local_1890;
  double local_1888;
  double local_1880;
  undefined8 uStack_1878;
  double local_1870;
  undefined8 uStack_1868;
  undefined1 local_1860 [8];
  undefined1 auStack_1858 [8];
  undefined1 local_1850 [8];
  undefined8 local_1848;
  undefined8 local_1840;
  double local_1838;
  undefined8 local_1830;
  double local_1828;
  double local_1820;
  undefined8 local_1818;
  double local_1810;
  double local_1808 [6];
  double local_17d8;
  undefined8 local_17d0;
  double local_17c8;
  ulong local_17c0;
  ulong uStack_17b8;
  undefined1 local_17b0 [16];
  Product<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
  local_1798;
  Matrix<double,_12,_12,_1,_12,_12> *local_1788;
  undefined1 local_1780 [72];
  undefined8 uStack_1738;
  undefined1 auStack_1730 [48];
  double dStack_1708;
  undefined1 local_1700 [64];
  undefined1 auStack_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 auStack_1680 [32];
  undefined1 local_1640 [328];
  double dStack_14f8;
  double dStack_14f0;
  double dStack_14e8;
  double dStack_14e0;
  double dStack_14d8;
  double dStack_14d0;
  double dStack_14c8;
  double local_14c0;
  double dStack_14b8;
  double dStack_14b0;
  double dStack_14a8;
  double dStack_14a0;
  double dStack_1498;
  double dStack_1490;
  double dStack_1488;
  double local_1480;
  double dStack_1478;
  double dStack_1470;
  double dStack_1468;
  double dStack_1460;
  double dStack_1458;
  double dStack_1450;
  double dStack_1448;
  double dStack_1440;
  double dStack_1438;
  double dStack_1430;
  double dStack_1428;
  double local_1420;
  double dStack_1418;
  double dStack_1410;
  double dStack_1408;
  double dStack_1400;
  double dStack_13f8;
  double dStack_13f0;
  double dStack_13e8;
  Matrix<double,_6,_6,_1,_6,_6> local_13c0;
  Matrix<double,_12,_12,_1,_12,_12> local_1280;
  Matrix<double,_12,_12,_1,_12,_12> local_e00;
  Matrix<double,_12,_12,_1,_12,_12> local_980;
  undefined1 local_500 [1232];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  dVar22 = (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                          super_ChBeamSectionEulerAdvancedGeneric.
                                          super_ChBeamSectionEuler + 0x30))();
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_1930 = (undefined1  [8])
               (**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler + 0x38))();
  uStack_1928 = extraout_XMM0_Qb;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_18f0 = (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                              super_ChBeamSectionEulerAdvancedGeneric.
                                              super_ChBeamSectionEuler + 0x40))();
  uStack_18e8 = extraout_XMM0_Qb_00;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_1910 = (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                              super_ChBeamSectionEulerAdvancedGeneric.
                                              super_ChBeamSectionEuler + 0x48))();
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_1870 = (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                              super_ChBeamSectionEulerAdvancedGeneric.
                                              super_ChBeamSectionEuler + 0x50))();
  uStack_1868 = extraout_XMM0_Qb_01;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_1940 = (undefined1  [8])
               (**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler + 0x30))();
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_1900 = (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                              super_ChBeamSectionEulerAdvancedGeneric.
                                              super_ChBeamSectionEuler + 0x38))();
  uStack_18f8 = extraout_XMM0_Qb_02;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_1860 = (undefined1  [8])
               (**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler + 0x40))();
  auStack_1858 = (undefined1  [8])extraout_XMM0_Qb_03;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_1918 = (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                              super_ChBeamSectionEulerAdvancedGeneric.
                                              super_ChBeamSectionEuler + 0x48))();
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  peVar4 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar5 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (peVar4->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_1880 = (double)(**(code **)(*(long *)&(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                                              super_ChBeamSectionEulerAdvancedGeneric.
                                              super_ChBeamSectionEuler + 0x50))();
  uStack_1878 = extraout_XMM0_Qb_04;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  local_1908 = (this->super_ChElementBeam).length;
  local_18e0[0] = cos(dVar22);
  auVar32._0_8_ = sin(dVar22);
  auVar32._8_56_ = extraout_var;
  local_1808[0] = 1.0;
  lVar20 = 0;
  local_1808[1] = 0.0;
  local_1808[2] = -0.0;
  local_17d8 = auVar32._0_8_ * 0.0;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_18e0[0];
  dVar22 = local_18e0[0] * 0.0;
  local_1808[3] = local_17d8 - dVar22;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_17d8;
  auVar21 = vfmadd213sd_fma(ZEXT816(0),auVar21,auVar41);
  local_1808[4] = auVar21._0_8_;
  local_17d8 = dVar22 + local_17d8;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar22;
  auVar21 = vfmsub213sd_fma(auVar37,ZEXT816(0) << 0x40,auVar32._0_16_);
  local_17d0 = auVar21._0_8_;
  local_17c8 = local_18e0[0];
  local_1808[5] = auVar32._0_8_;
  dVar23 = cos((double)local_1940);
  auVar33._0_8_ = sin((double)local_1940);
  auVar33._8_56_ = extraout_var_00;
  local_1850 = (undefined1  [8])0x3ff0000000000000;
  local_1848 = 0;
  local_1840 = 0x8000000000000000;
  local_1820 = auVar33._0_8_ * 0.0;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar23;
  dVar22 = dVar23 * 0.0;
  local_1838 = local_1820 - dVar22;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_1820;
  auVar21 = vfmadd213sd_fma(ZEXT816(0),auVar25,auVar42);
  local_1830 = auVar21._0_8_;
  local_1820 = dVar22 + local_1820;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar22;
  auVar21 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar38,auVar33._0_16_);
  local_1818 = auVar21._0_8_;
  local_1828 = auVar33._0_8_;
  local_1810 = dVar23;
  memset(&local_980,0,0x480);
  do {
    uVar3 = *(undefined8 *)((long)local_1808 + lVar20 + 8);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar20 * 4) = *(undefined8 *)((long)local_1808 + lVar20);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar20 * 4 + 8) = uVar3;
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar20 * 4 + 0x10) = *(undefined8 *)((long)local_1808 + lVar20 + 0x10);
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x48);
  lVar20 = 0x52;
  do {
    uVar3 = *(undefined8 *)(auStack_1858 + lVar20 + 6);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar20 * 4 + -0x10) = *(undefined8 *)(local_1860 + lVar20 + 6);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar20 * 4 + -8) = uVar3;
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar20 * 4) = *(undefined8 *)(local_1850 + lVar20 + 6);
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x9a);
  lVar20 = 0xa0;
  do {
    uVar3 = *(undefined8 *)((long)&uStack_18e8 + lVar20);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar20 * 4 + -0x10) = *(undefined8 *)((long)&local_18f0 + lVar20);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar20 * 4 + -8) = uVar3;
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar20 * 4) = *(undefined8 *)((long)local_18e0 + lVar20);
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0xe8);
  lVar20 = 0xee;
  do {
    uVar3 = *(undefined8 *)(auStack_1938 + lVar20 + 2);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar20 * 4 + -0x10) = *(undefined8 *)(local_1940 + lVar20 + 2);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar20 * 4 + -8) = uVar3;
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar20 * 4) = *(undefined8 *)(local_1930 + lVar20 + 2);
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x136);
  local_18e0[0] = local_1900 - (double)local_1930;
  local_18e0[1] = 0.0;
  dVar22 = (double)local_1860 - local_18f0;
  local_17b0._8_8_ = 0;
  local_17b0._0_8_ = dVar22;
  local_18e0[2] = local_18e0[0] * local_18e0[0];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_1908;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_18e0[2];
  auVar21 = vfmsub213sd_fma(auVar24,auVar24,auVar39);
  local_17c0 = 0x8000000000000000;
  uStack_17b8 = 0x8000000000000000;
  local_1940 = (undefined1  [8])-dVar22;
  auStack_1938 = (undefined1  [8])0x8000000000000000;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar22;
  auVar21 = vfnmadd231sd_fma(auVar21,local_17b0,auVar35);
  auVar34._0_8_ = pow(auVar21._0_8_,0.5);
  auVar34._8_56_ = extraout_var_01;
  auVar25 = auVar34._0_16_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_18e0[2];
  auVar21 = vfmadd231sd_fma(auVar26,auVar25,auVar25);
  dVar22 = pow(auVar21._0_8_,0.5);
  local_18e0[3] = auVar34._0_8_ / local_1908;
  local_18e0[4] = local_18e0[0] / dVar22;
  local_18e0[5] = ((double)local_17b0._0_8_ * auVar34._0_8_) / (local_1908 * dVar22);
  local_18e0[6] = (double)((ulong)local_18e0[0] ^ local_17c0) / local_1908;
  local_18a8 = auVar34._0_8_ / dVar22;
  local_18a0 = ((double)local_17b0._0_8_ * (double)((ulong)local_18e0[0] ^ local_17c0)) /
               (local_1908 * dVar22);
  dStack_1898 = (double)local_1940 / local_1908;
  local_1890 = 0;
  local_1888 = dVar22 / local_1908;
  if (this->use_Rc == true) {
    if (((this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows < 3) ||
       (lVar20 = (this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols, lVar20 < 3)) {
LAB_00680106:
      __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                    "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 3, BlockCols = 3, InnerPanel = false]"
                   );
    }
    pdVar16 = (this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_data + 2;
    lVar18 = 0x10;
    do {
      dVar22 = *(double *)((long)local_18e0 + lVar18 + 0x10);
      pdVar16[-2] = *(double *)((long)local_18e0 + lVar18 + 8);
      pdVar16[-1] = dVar22;
      *pdVar16 = *(double *)((long)local_18e0 + lVar18 + 0x18);
      lVar18 = lVar18 + 0x18;
      pdVar16 = pdVar16 + lVar20;
    } while (lVar18 != 0x58);
    if (((this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows < 6) ||
       (lVar20 = (this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols, lVar20 < 6)) goto LAB_00680106;
    pdVar16 = (this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_data + lVar20 * 3 + 5;
    lVar18 = 0x10;
    do {
      dVar22 = *(double *)((long)local_18e0 + lVar18 + 0x10);
      pdVar16[-2] = *(double *)((long)local_18e0 + lVar18 + 8);
      pdVar16[-1] = dVar22;
      *pdVar16 = *(double *)((long)local_18e0 + lVar18 + 0x18);
      lVar18 = lVar18 + 0x18;
      pdVar16 = pdVar16 + lVar20;
    } while (lVar18 != 0x58);
  }
  pdVar16 = (double *)&local_13c0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x21] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x22] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x23] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x19] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1a] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1c] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x10] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x11] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x13] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x14] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x15] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x16] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x17] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[8]
       = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[10]
       = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xb] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xd] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xe] = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0]
       = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[1]
       = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[2]
       = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[3]
       = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[6]
       = 0.0;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[7]
       = 0.0;
  lVar20 = 0;
  do {
    *pdVar16 = 1.0;
    lVar20 = lVar20 + 0x30;
    pdVar16 = pdVar16 + 7;
  } while (lVar20 != 0x120);
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[4]
       = local_18f0;
  auVar27._0_8_ = (ulong)local_1930 ^ local_17c0;
  auVar27._8_8_ = uStack_1928 ^ uStack_17b8;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[5]
       = (double)vmovlpd_avx(auVar27);
  auVar28._0_8_ = (ulong)local_18f0 ^ local_17c0;
  auVar28._8_8_ = uStack_18e8 ^ uStack_17b8;
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9]
       = (double)vmovlpd_avx(auVar28);
  local_13c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xf] = (double)local_1930;
  puVar17 = (undefined8 *)(local_1640 + 0x140);
  dStack_1400 = 0.0;
  dStack_13f8 = 0.0;
  dStack_13f0 = 0.0;
  dStack_13e8 = 0.0;
  dStack_1440 = 0.0;
  dStack_1438 = 0.0;
  dStack_1430 = 0.0;
  dStack_1428 = 0.0;
  local_1420 = 0.0;
  dStack_1418 = 0.0;
  dStack_1410 = 0.0;
  dStack_1408 = 0.0;
  local_1480 = 0.0;
  dStack_1478 = 0.0;
  dStack_1470 = 0.0;
  dStack_1468 = 0.0;
  dStack_1460 = 0.0;
  dStack_1458 = 0.0;
  dStack_1450 = 0.0;
  dStack_1448 = 0.0;
  local_14c0 = 0.0;
  dStack_14b0 = 0.0;
  dStack_14a8 = 0.0;
  dStack_14a0 = 0.0;
  dStack_1498 = 0.0;
  dStack_1490 = 0.0;
  local_1640._320_8_ = 0.0;
  dStack_14f8 = 0.0;
  dStack_14f0 = 0.0;
  dStack_14e8 = 0.0;
  dStack_14d0 = 0.0;
  dStack_14c8 = 0.0;
  lVar20 = 0;
  do {
    *puVar17 = 0x3ff0000000000000;
    lVar20 = lVar20 + 0x30;
    puVar17 = puVar17 + 7;
  } while (lVar20 != 0x120);
  dStack_14e0 = (double)local_1860;
  auVar29._0_8_ = (ulong)local_1900 ^ local_17c0;
  auVar29._8_8_ = uStack_18f8 ^ uStack_17b8;
  dStack_14d8 = (double)vmovlpd_avx(auVar29);
  auVar30._0_8_ = (ulong)local_1860 ^ local_17c0;
  auVar30._8_8_ = (ulong)auStack_1858 ^ uStack_17b8;
  dStack_14b8 = (double)vmovlpd_avx(auVar30);
  dStack_1488 = local_1900;
  puVar17 = (undefined8 *)local_500;
  lVar20 = 0;
  memset(puVar17,0,0x480);
  do {
    *puVar17 = 0x3ff0000000000000;
    lVar20 = lVar20 + 0x60;
    puVar17 = puVar17 + 0xd;
  } while (lVar20 != 0x480);
  if ((this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      == 6) {
    local_1640._0_8_ = &local_13c0;
    local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[0] = (double)local_500;
    local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[3] = 0.0;
    local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[4] = 0.0;
    local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[5] = 5.92878775009496e-323;
    local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[0] = 0.0;
    local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[1] = 0.0;
    local_1640._8_8_ = &this->Rc;
    local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[2] = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage
               .m_data.array[0];
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>,_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,_6,__1,_0,_6,__1> *)&local_e00,(SrcXprType *)local_1640,
          (assign_op<double,_double> *)local_1780);
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Matrix<double,6,_1,0,6,_1>,Eigen::internal::assign_op<double,double>>
              ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)&local_1280,
               (Matrix<double,_6,__1,_0,_6,__1> *)&local_e00,(assign_op<double,_double> *)local_1780
              );
    if (local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
        array[0] != 0.0) {
      free(*(void **)((long)local_e00.
                            super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                            m_storage.m_data.array[0] + -8));
    }
    if ((this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
        == 6) {
      local_1640._0_8_ = local_1640 + 0x140;
      src_00 = (SrcXprType *)local_1640;
      local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[0] = (double)(local_500 + 0x270);
      local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[2] = (double)local_500;
      local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[3] = 2.96439387504748e-323;
      local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[4] = 2.96439387504748e-323;
      local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[5] = 5.92878775009496e-323;
      local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[0] = 0.0;
      local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
      array[1] = 0.0;
      local_1640._8_8_ = &this->Rc;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>,_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,_6,__1,_0,_6,__1> *)&local_e00,src_00,
            (assign_op<double,_double> *)local_1780);
      src = (Index *)&local_e00;
      func = (assign_op<double,_double> *)local_1780;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Matrix<double,6,_1,0,6,_1>,Eigen::internal::assign_op<double,double>>
                ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)&local_1280,
                 (Matrix<double,_6,__1,_0,_6,__1> *)src,func);
      if (local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
          m_data.array[0] != 0.0) {
        free(*(void **)((long)local_e00.
                              super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                              m_storage.m_data.array[0] + -8));
      }
      local_18f0 = local_1910 - local_1918;
      local_1930 = (undefined1  [8])(local_1870 - local_1880);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_18f0 * local_18f0;
      auVar21 = vfmadd231sd_fma(auVar40,auVar25,auVar25);
      local_1900 = auVar21._0_8_;
      local_1940 = (undefined1  [8])pow(local_1900,0.5);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_1930;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_1900;
      auVar21 = vfmadd231sd_fma(auVar36,auVar31,auVar31);
      auStack_1938 = (undefined1  [8])extraout_XMM0_Qb_05;
      dVar22 = pow(auVar21._0_8_,0.5);
      bVar2 = this->use_simplified_correction_for_inclined_shear_axis;
      local_1640._256_8_ = 0.0;
      local_1640._264_8_ = 0.0;
      local_1640._272_8_ = 0.0;
      local_1640._280_8_ = 0.0;
      local_1640._192_8_ = 0.0;
      local_1640._200_8_ = 0.0;
      local_1640._208_8_ = 0.0;
      local_1640._216_8_ = 0.0;
      local_1640._224_8_ = 0.0;
      local_1640._232_8_ = 0.0;
      local_1640._240_8_ = 0.0;
      local_1640._248_8_ = 0.0;
      local_1640._128_8_ = 0.0;
      local_1640._136_8_ = 0.0;
      local_1640._144_8_ = 0.0;
      local_1640._152_8_ = 0.0;
      local_1640._160_8_ = 0.0;
      local_1640._168_8_ = 0.0;
      local_1640._176_8_ = 0.0;
      local_1640._184_8_ = 0.0;
      local_1640._64_8_ = 0.0;
      local_1640._80_8_ = 0.0;
      local_1640._88_8_ = 0.0;
      local_1640._96_8_ = 0.0;
      local_1640._104_8_ = 0.0;
      local_1640._112_8_ = 0.0;
      local_1640._0_8_ = (Matrix<double,_6,_6,_1,_6,_6> *)0x0;
      local_1640._8_8_ = (ChMatrixDynamic<> *)0x0;
      local_1640._16_8_ = 0.0;
      local_1640._24_8_ = 0.0;
      local_1640._32_8_ = 0.0;
      local_1640._40_8_ = 0.0;
      local_1640._48_8_ = 0.0;
      local_1640._56_8_ = 0.0;
      lVar20 = 0;
      do {
        src_00->m_lhs = (LhsNested)0x3ff0000000000000;
        lVar20 = lVar20 + 0x30;
        src_00 = (SrcXprType *)&src_00[3].m_rhs;
      } while (lVar20 != 0x120);
      auVar15._8_8_ = uStack_1868;
      auVar15._0_8_ = local_1870;
      auVar7._8_8_ = 0x8000000000000000;
      auVar7._0_8_ = 0x8000000000000000;
      auVar21 = vxorpd_avx512vl(auVar15,auVar7);
      local_1640._72_8_ = vmovlpd_avx(auVar21);
      local_1640._120_8_ = local_1910;
      local_1780._0_64_ = ZEXT864(0) << 0x20;
      auStack_1680 = (undefined1  [32])0x0;
      auStack_16c0 = local_1780._0_32_;
      lVar20 = 0;
      unique0x10002d1b = local_1780._0_64_;
      local_1700 = local_1780._0_64_;
      local_16a0 = auStack_1680;
      do {
        *(undefined8 *)func = 0x3ff0000000000000;
        lVar20 = lVar20 + 0x30;
        func = func + 0x38;
      } while (lVar20 != 0x120);
      auVar14._8_8_ = uStack_1878;
      auVar14._0_8_ = local_1880;
      auVar8._8_8_ = 0x8000000000000000;
      auVar8._0_8_ = 0x8000000000000000;
      auVar21 = vxorpd_avx512vl(auVar14,auVar8);
      uVar3 = vmovlpd_avx(auVar21);
      uStack_1738 = uVar3;
      dStack_1708 = local_1918;
      if (this->use_Rs == true) {
        lVar20 = (this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_rows;
        if ((lVar20 < 4) ||
           (lVar18 = (this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar18 < 4)) {
LAB_006800c5:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                       );
        }
        pdVar16 = (this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        pdVar16[lVar18 * 3 + 3] = dVar22 / auVar34._0_8_;
        if ((lVar20 == 4) ||
           (pdVar16[lVar18 * 4 + 3] =
                 (double)((ulong)(bVar2 & 1) * (long)(local_18f0 / auVar34._0_8_) +
                         (ulong)!(bool)(bVar2 & 1) *
                         (long)((local_18f0 * dVar22) / (auVar34._0_8_ * (double)local_1940))),
           lVar20 < 6)) goto LAB_006800c5;
        pdVar16[lVar18 * 5 + 3] =
             (double)local_1930 /
             (double)((ulong)(bVar2 & 1) * (long)auVar34._0_8_ +
                     (ulong)!(bool)(bVar2 & 1) * (long)local_1940);
      }
      lVar20 = 0;
      memset(src,0,0x480);
      do {
        *src = 0x3ff0000000000000;
        lVar20 = lVar20 + 0x60;
        src = src + 0xd;
      } while (lVar20 != 0x480);
      if ((this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols == 6) {
        local_1798.m_rhs = (RhsNested)local_1640;
        local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[3] = 0.0;
        local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[4] = 0.0;
        local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[5] = 5.92878775009496e-323;
        local_1798.m_lhs = (LhsNested)&this->Rs;
        local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[0] = (double)&local_e00;
        local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
        .array[2] = (double)&local_e00;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::internal::assign_op<double,double>>
                  ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)&local_1280,
                   (Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
                    *)&local_1798,(assign_op<double,_double> *)&local_1948,(type)0x0);
        if ((this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols == 6) {
          local_1798.m_rhs = (RhsNested)local_1780;
          local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
          m_data.array[0] =
               (double)(local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                        m_storage.m_data.array + 0x4e);
          local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
          m_data.array[3] = 2.96439387504748e-323;
          local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
          m_data.array[4] = 2.96439387504748e-323;
          local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
          m_data.array[5] = 5.92878775009496e-323;
          local_1798.m_lhs = (LhsNested)&this->Rs;
          local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
          m_data.array[2] = (double)&local_e00;
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::internal::assign_op<double,double>>
                    ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)&local_1280,
                     (Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
                      *)&local_1798,(assign_op<double,_double> *)&local_1948,(type)0x0);
          local_1798.m_lhs = &local_980;
          local_1798.m_rhs = &local_e00;
          local_1788 = (Matrix<double,_12,_12,_1,_12,_12> *)local_500;
          memset(&local_1280,0,0x480);
          local_1948 = 1.0;
          Eigen::internal::
          generic_product_impl<Eigen::Product<Eigen::Matrix<double,12,12,1,12,12>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,12,1,12,12>,Eigen::DenseShape,Eigen::DenseShape,8>
          ::scaleAndAddTo<Eigen::Matrix<double,12,12,1,12,12>>
                    (&local_1280,&local_1798,(Matrix<double,_12,_12,_1,_12,_12> *)local_500,
                     &local_1948);
          if (((this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_rows != 0xc) ||
             ((this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_cols != 0xc)) {
            Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                      ((DenseStorage<double,__1,__1,__1,_1> *)&this->T,0x90,0xc,0xc);
          }
          if (((this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_rows == 0xc) &&
             ((this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_cols == 0xc)) {
            pdVar16 = (this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_data;
            uVar19 = 0xfffffffffffffff8;
            do {
              dVar22 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                       m_storage.m_data.array[uVar19 + 9];
              dVar23 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                       m_storage.m_data.array[uVar19 + 10];
              dVar9 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                      m_storage.m_data.array[uVar19 + 0xb];
              dVar10 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                       m_storage.m_data.array[uVar19 + 0xc];
              dVar11 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                       m_storage.m_data.array[uVar19 + 0xd];
              dVar12 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                       m_storage.m_data.array[uVar19 + 0xe];
              dVar13 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                       m_storage.m_data.array[uVar19 + 0xf];
              pdVar1 = pdVar16 + uVar19 + 8;
              *pdVar1 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
                        m_storage.m_data.array[uVar19 + 8];
              pdVar1[1] = dVar22;
              pdVar1[2] = dVar23;
              pdVar1[3] = dVar9;
              pdVar1[4] = dVar10;
              pdVar1[5] = dVar11;
              pdVar1[6] = dVar12;
              pdVar1[7] = dVar13;
              uVar19 = uVar19 + 8;
            } while (uVar19 < 0x88);
            return;
          }
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::Matrix<double, 12, 12, 1>, T1 = double, T2 = double]"
                       );
        }
      }
      __function = 
      "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 6, 6, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 6, 6, 1>, Option = 0]"
      ;
      goto LAB_006800fc;
    }
  }
  __function = 
  "Eigen::Product<Eigen::Matrix<double, 6, 6, 1>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 6, 6, 1>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
  ;
LAB_006800fc:
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeTransformMatrix() {
    double alpha1 = this->tapered_section->GetSectionA()->GetSectionRotation();
    double Cy1 = this->tapered_section->GetSectionA()->GetCentroidY();
    double Cz1 = this->tapered_section->GetSectionA()->GetCentroidZ();
    double Sy1 = this->tapered_section->GetSectionA()->GetShearCenterY();
    double Sz1 = this->tapered_section->GetSectionA()->GetShearCenterZ();

    double alpha2 = this->tapered_section->GetSectionB()->GetSectionRotation();
    double Cy2 = this->tapered_section->GetSectionB()->GetCentroidY();
    double Cz2 = this->tapered_section->GetSectionB()->GetCentroidZ();
    double Sy2 = this->tapered_section->GetSectionB()->GetShearCenterY();
    double Sz2 = this->tapered_section->GetSectionB()->GetShearCenterZ();

    double L = this->length;

    // In case the section is rotated:
    ChMatrix33<> RotsectA;
    RotsectA.Set_A_Rxyz(ChVector<>(alpha1, 0, 0));
    ChMatrix33<> RotsectB;
    RotsectB.Set_A_Rxyz(ChVector<>(alpha2, 0, 0));
    ChMatrixNM<double, 12, 12> Rotsect;
    Rotsect.setZero();
    Rotsect.block<3, 3>(0, 0) = RotsectA;
    Rotsect.block<3, 3>(3, 3) = RotsectA;
    Rotsect.block<3, 3>(6, 6) = RotsectB;
    Rotsect.block<3, 3>(9, 9) = RotsectB;

    // In case the section has a centroid displacement:
    // double dCx = 0;
    double dCy = Cy2 - Cy1;
    double dCz = Cz2 - Cz1;
    double LN = L;
    double LG = pow(LN * LN - dCy * dCy - dCz * dCz, 0.5);
    double LA = LG;
    double LB = pow(LG * LG + dCy * dCy, 0.5);
    ChMatrix33<> rc;
    rc.setIdentity();
    rc(0, 0) = LA / LN;
    rc(0, 1) = dCy / LB;
    rc(0, 2) = LA * dCz / (LN * LB);
    rc(1, 0) = -dCy / LN;
    rc(1, 1) = LA / LB;
    rc(1, 2) = -dCy * dCz / (LN * LB);
    rc(2, 0) = -dCz / LN;
    rc(2, 1) = 0.0;
    rc(2, 2) = LB / LN;
    // ChMatrixNM<double, 6, 6> Rc;
    // Rc.setIdentity();
    if (use_Rc) {
        this->Rc.block<3, 3>(0, 0) = rc;
        this->Rc.block<3, 3>(3, 3) = rc;
    }

    ChMatrixNM<double, 6, 6> Tc1;
    Tc1.setIdentity();
    Tc1(0, 4) = Cz1;
    Tc1(0, 5) = -Cy1;
    Tc1(1, 3) = -Cz1;
    Tc1(2, 3) = Cy1;

    ChMatrixNM<double, 6, 6> Tc2;
    Tc2.setIdentity();
    Tc2(0, 4) = Cz2;
    Tc2(0, 5) = -Cy2;
    Tc2(1, 3) = -Cz2;
    Tc2(2, 3) = Cy2;

    ChMatrixNM<double, 12, 12> Tc;
    Tc.setIdentity();
    Tc.block<6, 6>(0, 0) = Tc1 * Rc;
    Tc.block<6, 6>(6, 6) = Tc2 * Rc;

    // In case the section has a shear center displacement:
    // The shear center offset is respect to the centerline of beam element.
    /*Sy1 = Sy1 - Cy1;  // Unnecessary to do this substraction
    Sz1 = Sz1 - Cz1;
    Sy2 = Sy2 - Cy2;
    Sz2 = Sz2 - Cz2;*/
    double dSy = Sy1 - Sy2;
    double dSz = Sz1 - Sz2;

    double Lsy = pow(LG * LG + dSy * dSy, 0.5);
    double Lsyz = pow(LG * LG + dSy * dSy + dSz * dSz, 0.5);
    double C1 = Lsyz / LG;
    double C2 = dSy * Lsyz / (LG * Lsy);
    double C3 = dSz / Lsy;
    if (this->use_simplified_correction_for_inclined_shear_axis) {
        C1 = Lsyz / LG;
        C2 = dSy / LG;
        C3 = dSz / LG;
    }

    ChMatrixNM<double, 6, 6> Ts1;
    Ts1.setIdentity();
    Ts1(1, 3) = -Sz1;
    Ts1(2, 3) = Sy1;

    ChMatrixNM<double, 6, 6> Ts2;
    Ts2.setIdentity();
    Ts2(1, 3) = -Sz2;
    Ts2(2, 3) = Sy2;

    // ChMatrixNM<double, 6, 6> Rs;
    // Rs.setIdentity();
    if (use_Rs) {
        this->Rs(3, 3) = C1;
        this->Rs(4, 3) = C2;
        this->Rs(5, 3) = C3;
    }

    ChMatrixNM<double, 12, 12> Ts;
    Ts.setIdentity();
    Ts.block<6, 6>(0, 0) = Rs * Ts1;
    Ts.block<6, 6>(6, 6) = Rs * Ts2;

    this->T = Rotsect * Ts * Tc;
}